

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O2

int __thiscall
dg::vr::VRLocation::connect(VRLocation *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  __uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> local_20;
  
  local_20._M_t.super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
  super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl =
       (tuple<dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>)operator_new(0x20);
  *(VRLocation **)
   local_20._M_t.super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
   super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl = this;
  *(ulong *)((long)local_20._M_t.
                   super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
                   super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 8) =
       CONCAT44(in_register_00000034,__fd);
  *(sockaddr **)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
          super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 0x10) = __addr;
  *(undefined4 *)
   ((long)local_20._M_t.
          super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
          super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl + 0x18) = 3;
  connect(this,(int)&local_20,__addr_00,__len);
  std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>::~unique_ptr
            ((unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *)&local_20);
  return extraout_EAX;
}

Assistant:

void VRLocation::connect(VRLocation *target, VROp *op) {
    connect(std::unique_ptr<VREdge>(new VREdge(this, target, op)));
}